

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_lessequal(lua_State *L,TValue *l,TValue *r)

{
  uint uVar1;
  int iVar2;
  
  if (l->tt_ == 3) {
    if (r->tt_ == 3) {
      return (uint)((l->value_).n <= (r->value_).n);
    }
  }
  else if (((l->tt_ & 0xfU) == 4) && ((r->tt_ & 0xfU) == 4)) {
    iVar2 = l_strcmp(&((l->value_).gc)->ts,&((r->value_).gc)->ts);
    return (uint)(iVar2 < 1);
  }
  uVar1 = call_orderTM(L,l,r,TM_LE);
  if ((int)uVar1 < 0) {
    iVar2 = call_orderTM(L,r,l,TM_LT);
    if (iVar2 < 0) {
      luaG_ordererror(L,l,r);
    }
    uVar1 = (uint)(iVar2 == 0);
  }
  return uVar1;
}

Assistant:

int luaV_lessequal (lua_State *L, const TValue *l, const TValue *r) {
  int res;
  if (ttisnumber(l) && ttisnumber(r))
    return luai_numle(L, nvalue(l), nvalue(r));
  else if (ttisstring(l) && ttisstring(r))
    return l_strcmp(rawtsvalue(l), rawtsvalue(r)) <= 0;
  else if ((res = call_orderTM(L, l, r, TM_LE)) >= 0)  /* first try `le' */
    return res;
  else if ((res = call_orderTM(L, r, l, TM_LT)) < 0)  /* else try `lt' */
    luaG_ordererror(L, l, r);
  return !res;
}